

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigNode.c
# Opt level: O2

Fraig_Node_t * Fraig_NodeCreate(Fraig_Man_t *p,Fraig_Node_t *p1,Fraig_Node_t *p2)

{
  Fraig_NodeVec_t *p_00;
  uint uVar1;
  int iVar2;
  Fraig_Node_t *Entry;
  abctime aVar3;
  uint *puVar4;
  abctime aVar5;
  uint uVar6;
  Fraig_Node_t *pFanin;
  Fraig_Node_t *pFanin_00;
  
  Entry = (Fraig_Node_t *)Fraig_MemFixedEntryFetch(p->mmNodes);
  memset(Entry,0,0xa0);
  Entry->p1 = p1;
  pFanin = (Fraig_Node_t *)((ulong)p1 & 0xfffffffffffffffe);
  pFanin->nRefs = pFanin->nRefs + 1;
  Entry->p2 = p2;
  pFanin_00 = (Fraig_Node_t *)((ulong)p2 & 0xfffffffffffffffe);
  pFanin_00->nRefs = pFanin_00->nRefs + 1;
  p_00 = p->vNodes;
  Entry->Num = p_00->nSize;
  Fraig_NodeVecPush(p_00,Entry);
  Entry->NumPi = -1;
  iVar2 = pFanin_00->Level;
  if (pFanin_00->Level < pFanin->Level) {
    iVar2 = pFanin->Level;
  }
  Entry->Level = iVar2 + 1;
  if (((ulong)p1 & 1) == 0) {
    uVar1 = *(uint *)&p1->field_0x18;
  }
  else {
    uVar1 = ~*(uint *)&pFanin->field_0x18;
  }
  if (((ulong)p2 & 1) == 0) {
    uVar6 = *(uint *)&p2->field_0x18;
  }
  else {
    uVar6 = ~*(uint *)&pFanin_00->field_0x18;
  }
  uVar6 = uVar6 & 1 & uVar1 & 1;
  uVar1 = *(uint *)&Entry->field_0x18;
  *(uint *)&Entry->field_0x18 = uVar1 & 0xfffffffe | uVar6;
  *(uint *)&Entry->field_0x18 =
       uVar1 & 0xfffffdfe | uVar6 |
       (*(uint *)&pFanin_00->field_0x18 | *(uint *)&pFanin->field_0x18) & 0x200;
  aVar3 = Abc_Clock();
  puVar4 = (uint *)Fraig_MemFixedEntryFetch(p->mmSims);
  Entry->puSimR = puVar4;
  iVar2 = p->nWordsRand;
  Entry->puSimD = puVar4 + iVar2;
  Entry->uHashR = 0;
  Fraig_NodeSimulate(Entry,0,iVar2,1);
  Entry->uHashD = 0;
  Fraig_NodeSimulate(Entry,0,p->iWordStart,0);
  iVar2 = Fraig_BitStringCountOnes(Entry->puSimR,p->nWordsRand);
  uVar1 = *(uint *)&Entry->field_0x18;
  uVar6 = uVar1 & 0xfff;
  *(uint *)&Entry->field_0x18 = uVar6 + iVar2 * 0x1000;
  if ((uVar1 & 1) != 0) {
    *(uint *)&Entry->field_0x18 = p->nWordsRand * 0x20000 + iVar2 * -0x1000 | uVar6;
  }
  aVar5 = Abc_Clock();
  p->timeSims = p->timeSims + (aVar5 - aVar3);
  Fraig_NodeAddFaninFanout(pFanin,Entry);
  Fraig_NodeAddFaninFanout(pFanin_00,Entry);
  return Entry;
}

Assistant:

Fraig_Node_t * Fraig_NodeCreate( Fraig_Man_t * p, Fraig_Node_t * p1, Fraig_Node_t * p2 )
{
    Fraig_Node_t * pNode;
    abctime clk;

    // create the node
    pNode = (Fraig_Node_t *)Fraig_MemFixedEntryFetch( p->mmNodes );
    memset( pNode, 0, sizeof(Fraig_Node_t) );

    // assign the children
    pNode->p1  = p1;  Fraig_Ref(p1);  Fraig_Regular(p1)->nRefs++;
    pNode->p2  = p2;  Fraig_Ref(p2);  Fraig_Regular(p2)->nRefs++;

    // assign the number and add to the array of nodes
    pNode->Num = p->vNodes->nSize;
    Fraig_NodeVecPush( p->vNodes,  pNode );

    // assign the PI number
    pNode->NumPi = -1;

    // compute the level of this node
    pNode->Level = 1 + Abc_MaxInt(Fraig_Regular(p1)->Level, Fraig_Regular(p2)->Level);
    pNode->fInv  = Fraig_NodeIsSimComplement(p1) & Fraig_NodeIsSimComplement(p2);
    pNode->fFailTfo = Fraig_Regular(p1)->fFailTfo | Fraig_Regular(p2)->fFailTfo;

    // derive the simulation info 
clk = Abc_Clock();
    // allocate memory for the simulation info
    pNode->puSimR = (unsigned *)Fraig_MemFixedEntryFetch( p->mmSims );
    pNode->puSimD = pNode->puSimR + p->nWordsRand;
    // derive random simulation info
    pNode->uHashR = 0;
    Fraig_NodeSimulate( pNode, 0, p->nWordsRand, 1 );
    // derive dynamic simulation info
    pNode->uHashD = 0;
    Fraig_NodeSimulate( pNode, 0, p->iWordStart, 0 );
    // count the number of ones in the random simulation info
    pNode->nOnes = Fraig_BitStringCountOnes( pNode->puSimR, p->nWordsRand );
    if ( pNode->fInv )
        pNode->nOnes = p->nWordsRand * 32 - pNode->nOnes;
    // add to the runtime of simulation
p->timeSims += Abc_Clock() - clk;

#ifdef FRAIG_ENABLE_FANOUTS
    // create the fanout info
    Fraig_NodeAddFaninFanout( Fraig_Regular(p1), pNode );
    Fraig_NodeAddFaninFanout( Fraig_Regular(p2), pNode );
#endif
    return pNode;
}